

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall ddd::DaTrie<true,_false,_false>::~DaTrie(DaTrie<true,_false,_false> *this)

{
  std::_Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::~_Vector_base
            (&(this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>)
  ;
  std::_Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::~_Vector_base
            (&(this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->tail_).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>::~_Vector_base
            ((_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> *)this);
  return;
}

Assistant:

~DaTrie() {}